

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace_align4,size_t wkspSize,
                 HUF_CElt *oldHufTable,HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  HUF_CElt *tree;
  int iVar1;
  HUF_repeat HVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  BYTE *pBVar7;
  size_t _var_err__;
  bool bVar8;
  bool bVar9;
  HUF_CElt *pHVar10;
  int in_stack_ffffffffffffffa0;
  uint maxSymbolValue_local;
  ulong local_50;
  BYTE *local_48;
  HUF_CElt *local_40;
  void *local_38;
  
  if (wkspSize < 0x1900) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  local_48 = (BYTE *)((long)dst + dstSize);
  uVar3 = 0xb;
  if (huffLog != 0) {
    uVar3 = huffLog;
  }
  bVar8 = preferRepeat != 0;
  bVar9 = repeat != (HUF_repeat *)0x0;
  if ((bVar9 && bVar8) && (*repeat == HUF_repeat_valid)) {
    sVar4 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_48,src,srcSize,nbStreams,oldHufTable,
                       in_stack_ffffffffffffffa0);
    return sVar4;
  }
  local_50 = CONCAT44(local_50._4_4_,uVar3);
  sVar4 = HIST_count_wksp((uint *)workSpace_align4,&maxSymbolValue_local,src,srcSize,
                          workSpace_align4,wkspSize);
  if (0xffffffffffffff88 < sVar4) {
    return sVar4;
  }
  if (sVar4 == srcSize) {
    *(undefined1 *)dst = *src;
    return 1;
  }
  if (sVar4 <= (srcSize >> 7) + 4) {
    return 0;
  }
  pHVar10 = oldHufTable;
  pBVar7 = (BYTE *)dst;
  if (repeat != (HUF_repeat *)0x0) {
    HVar2 = *repeat;
    if (HVar2 == HUF_repeat_check) {
      iVar1 = HUF_validateCTable(oldHufTable,(uint *)workSpace_align4,maxSymbolValue_local);
      if (iVar1 != 0) {
        if (bVar9 && bVar8) goto LAB_002047b3;
        goto LAB_002046a8;
      }
      *repeat = HUF_repeat_none;
      HVar2 = HUF_repeat_none;
    }
    if ((bVar9 && bVar8) && HVar2 != HUF_repeat_none) goto LAB_002047b3;
  }
LAB_002046a8:
  uVar3 = HUF_optimalTableLog((uint)local_50,srcSize,maxSymbolValue_local);
  tree = (HUF_CElt *)((long)workSpace_align4 + 0x400);
  local_50 = (ulong)maxSymbolValue_local;
  local_38 = (void *)((long)workSpace_align4 + 0x800);
  sVar4 = HUF_buildCTable_wksp
                    (tree,(uint *)workSpace_align4,maxSymbolValue_local,uVar3,local_38,0x1100);
  if (0xffffffffffffff88 < sVar4) {
    return sVar4;
  }
  uVar5 = (ulong)((int)local_50 + 1);
  memset(tree + uVar5,0,uVar5 * -4 + 0x400);
  local_40 = tree;
  sVar4 = HUF_writeCTable_wksp(dst,dstSize,tree,(uint)local_50,(uint)sVar4,local_38,0x2c0);
  uVar3 = maxSymbolValue_local;
  if (0xffffffffffffff88 < sVar4) {
    return sVar4;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar4 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat != HUF_repeat_none) {
      local_50 = HUF_estimateCompressedSize
                           (oldHufTable,(uint *)workSpace_align4,maxSymbolValue_local);
      sVar6 = HUF_estimateCompressedSize(local_40,(uint *)workSpace_align4,uVar3);
      if ((srcSize <= sVar4 + 0xc) || (local_50 <= sVar6 + sVar4)) goto LAB_002047b3;
    }
    if (srcSize <= sVar4 + 0xc) {
      return 0;
    }
    *repeat = HUF_repeat_none;
  }
  pHVar10 = local_40;
  pBVar7 = (BYTE *)(sVar4 + (long)dst);
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,local_40,0x400);
  }
LAB_002047b3:
  sVar4 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar7,local_48,src,srcSize,nbStreams,pHVar10,
                     in_stack_ffffffffffffffa0);
  return sVar4;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace_align4, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                 const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace_align4;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    HUF_STATIC_ASSERT(sizeof(*table) <= HUF_WORKSPACE_SIZE);
    assert(((size_t)workSpace_align4 & 3) == 0);   /* must be aligned on 4-bytes boundaries */

    /* checks & inits */
    if (wkspSize < HUF_WORKSPACE_SIZE) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, workSpace_align4, wkspSize) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        ZSTD_memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, bmi2);
}